

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

essentials_t *
opengv::relative_pose::fivept_nister
          (essentials_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  essentials_t *peVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  size_t i;
  double dVar7;
  long lVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  MatrixXd Q;
  size_t numberCorrespondences;
  bearingVector_t fprime;
  bearingVector_t f;
  Matrix<double,_9,_4,_0,_9,_4> EE;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  Matrix<double,__1,__1,_0,__1,__1> local_428;
  essentials_t *local_410;
  double local_408;
  undefined1 local_400 [16];
  ulong local_3f0;
  double *local_3e0;
  undefined8 uStack_3d8;
  ulong local_3d0;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  double local_3b0;
  Matrix<double,_9,_4,_0,_9,_4> local_3a0;
  undefined1 local_278 [584];
  
  local_408 = (double)indices->_numberCorrespondences;
  local_278._0_4_ = 9;
  local_410 = __return_storage_ptr__;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_428,(unsigned_long *)&local_408,(int *)local_278
            );
  lVar5 = 0;
  lVar8 = 0;
  for (dVar7 = 0.0; (ulong)dVar7 < (ulong)local_408; dVar7 = (double)((long)dVar7 + 1)) {
    iVar6 = SUB84(dVar7,0);
    iVar4 = iVar6;
    if (indices->_useIndices != false) {
      iVar4 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (lVar8 >> 0x1e));
    }
    (*adapter->_vptr_RelativeAdapterBase[3])(&local_3e0,adapter,(long)iVar4);
    if (indices->_useIndices != false) {
      iVar6 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (lVar8 >> 0x1e));
    }
    (*adapter->_vptr_RelativeAdapterBase[2])(local_400,adapter,(long)iVar6);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_3d0;
    auVar9 = vbroadcastsd_avx512f(auVar1);
    local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>.m_storage.m_data.array[0]
         = (double)((long)local_428.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_data + lVar5);
    local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>.m_storage.m_data.array[3]
         = (double)&local_428;
    local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>.m_storage.m_data.array[2]
         = (double)local_428.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
    local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>.m_storage.m_data.array[5]
         = 0.0;
    local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>.m_storage.m_data.array[6]
         = 4.94065645841247e-324;
    vinsertf32x4_avx512f(ZEXT1664(local_400),local_400,1);
    auVar10 = vpermt2pd_avx512f(_DAT_003bbc80,auVar9);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_3f0;
    auVar11 = vbroadcastsd_avx512f(auVar2);
    auVar12 = vpermt2pd_avx512f(_DAT_003bbcc0,auVar11);
    local_278._0_64_ = vmulpd_avx512f(auVar10,auVar12);
    local_278._64_8_ = auVar9._0_8_ * auVar11._0_8_;
    local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>.m_storage.m_data.array[4]
         = dVar7;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,1,9,1,1,9>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&local_3a0,
               (Matrix<double,_1,_9,_1,_1,_9> *)local_278);
    lVar5 = lVar5 + 8;
    lVar8 = lVar8 + 0x100000000;
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_278,&local_428,0x10);
  local_3c8 = local_278 + 0x18;
  local_3e0 = (double *)(local_278._24_8_ + local_278._32_8_ * 5 * 8);
  uStack_3d8 = 9;
  local_3d0 = 4;
  local_3c0 = 0;
  local_3b8 = 5;
  local_3b0 = (double)local_278._32_8_;
  Eigen::PlainObjectBase<Eigen::Matrix<double,9,4,0,9,4>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,9,4,0,9,4>> *)&local_3a0,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
              *)&local_3e0);
  peVar3 = local_410;
  (local_410->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_410->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_410->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  modules::fivept_nister_main(&local_3a0,local_410);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_278);
  Eigen::internal::handmade_aligned_free
            (local_428.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
  return peVar3;
}

Assistant:

essentials_t fivept_nister(
    const RelativeAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 4);

  Eigen::MatrixXd Q(numberCorrespondences,9);
  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    //bearingVector_t f = adapter.getBearingVector1(indices[i]);
    //bearingVector_t fprime = adapter.getBearingVector2(indices[i]);
    //Nister's algorithm is computing the inverse transformation, so we simply
    //invert the input here
    bearingVector_t f = adapter.getBearingVector2(indices[i]);
    bearingVector_t fprime = adapter.getBearingVector1(indices[i]);
    Eigen::Matrix<double,1,9> row;
    row <<  f[0]*fprime[0], f[1]*fprime[0], f[2]*fprime[0],
        f[0]*fprime[1], f[1]*fprime[1], f[2]*fprime[1],
        f[0]*fprime[2], f[1]*fprime[2], f[2]*fprime[2];
    Q.row(i) = row;
  }

  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(Q, Eigen::ComputeFullV );
  Eigen::Matrix<double,9,4> EE = SVD.matrixV().block(0,5,9,4);
  essentials_t essentials;
  modules::fivept_nister_main(EE,essentials);

  return essentials;
}